

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePicker::setTimeRange(DateTimePicker *this,QTime *min,QTime *max)

{
  QDate QVar1;
  char cVar2;
  QDateTime aQStack_28 [8];
  QDateTime local_20 [8];
  
  cVar2 = QTime::isValid();
  if (cVar2 != '\0') {
    cVar2 = QTime::isValid();
    if (cVar2 != '\0') {
      QVar1.jd = QDateTime::date();
      QDateTime::QDateTime(local_20,QVar1,(QTime)min->mds,((this->d).d)->spec,0);
      QVar1.jd = QDateTime::date();
      QDateTime::QDateTime(aQStack_28,QVar1,(QTime)max->mds,((this->d).d)->spec,0);
      setDateTimeRange(this,local_20,aQStack_28);
      QDateTime::~QDateTime(aQStack_28);
      QDateTime::~QDateTime(local_20);
    }
  }
  return;
}

Assistant:

void
DateTimePicker::setTimeRange( const QTime & min, const QTime & max )
{
	if( min.isValid() && max.isValid() )
		setDateTimeRange( QDateTime( d->minimum.date(), min, d->spec ),
			QDateTime( d->maximum.date(), max, d->spec ) );
}